

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

void __thiscall
QGraphicsWidgetPrivate::windowFrameHoverLeaveEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneHoverEvent *event)

{
  long lVar1;
  bool bVar2;
  QGraphicsWidgetPrivate *this_00;
  pointer pWVar3;
  QRectF *in_RSI;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  bool needsUpdate;
  QGraphicsWidget *q;
  undefined7 in_stack_ffffffffffffffa8;
  byte bVar4;
  QGraphicsWidgetPrivate *this_01;
  QGraphicsItem *in_stack_ffffffffffffffc8;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = (QGraphicsWidgetPrivate *)q_func(in_RDI);
  bVar2 = hasDecoration(this_00);
  if (bVar2) {
    QGraphicsItem::unsetCursor(in_stack_ffffffffffffffc8);
    ensureWindowData(in_RDI);
    bVar4 = 0;
    pWVar3 = std::
             unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                           *)0xa59c15);
    if ((pWVar3->hoveredSubControl == SC_ComboBoxListBoxPopup) ||
       (pWVar3 = std::
                 unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                 ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                               *)0xa59c2c), (pWVar3->field_0x20 & 1) != 0)) {
      bVar4 = 1;
    }
    pWVar3 = std::
             unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                           *)0xa59c4f);
    pWVar3->hoveredSubControl = SC_None;
    pWVar3 = std::
             unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                           *)0xa59c67);
    pWVar3->field_0x20 = pWVar3->field_0x20 & 0xfe;
    QRect::QRect((QRect *)in_RDI);
    pWVar3 = std::
             unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                           *)0xa59c8e);
    (pWVar3->buttonRect).x1 = (Representation)(undefined4)local_18;
    (pWVar3->buttonRect).y1 = (Representation)local_18._4_4_;
    (pWVar3->buttonRect).x2 = (Representation)(undefined4)local_10;
    (pWVar3->buttonRect).y2 = (Representation)local_10._4_4_;
    if ((bVar4 & 1) != 0) {
      std::
      unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                    *)0xa59cc5);
      QRectF::QRectF((QRectF *)this_00,(QRect *)CONCAT17(bVar4,in_stack_ffffffffffffffa8));
      QGraphicsItem::update((QGraphicsItem *)this_01,in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameHoverLeaveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_UNUSED(event);
    Q_Q(QGraphicsWidget);
    if (hasDecoration()) {
        // ### restore the cursor, don't override it
#ifndef QT_NO_CURSOR
        q->unsetCursor();
#endif

        ensureWindowData();

        bool needsUpdate = false;
        if (windowData->hoveredSubControl == QStyle::SC_TitleBarCloseButton
            || windowData->buttonMouseOver)
            needsUpdate = true;

        // update the hover state (of buttons etc...)
        windowData->hoveredSubControl = QStyle::SC_None;
        windowData->buttonMouseOver = false;
        windowData->buttonRect = QRect();
        if (needsUpdate)
            q->update(windowData->buttonRect);
    }
}